

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,string *linkLibs,string *flags,string *linkFlags,
          string *frameworkPath,string *linkPath,cmGeneratorTarget *target,bool useWatcomQuote)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmMakefile *pcVar5;
  char *pcVar6;
  cmSourceFile *this_00;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  long *plVar10;
  char *__s;
  string *psVar11;
  undefined8 *puVar12;
  ulong *puVar13;
  undefined8 uVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  char *__end;
  string linkLanguage;
  string sFlagVar;
  string buildType;
  string local_b0;
  string *local_90;
  string *local_88;
  string *local_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  cmOutputConverter *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar5 = this->Makefile;
  paVar2 = &linkLanguage.field_2;
  linkLanguage._M_dataplus._M_p = (pointer)paVar2;
  local_90 = linkLibs;
  local_88 = frameworkPath;
  local_80 = linkPath;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"CMAKE_BUILD_TYPE","");
  pcVar9 = cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
  std::__cxx11::string::string((string *)&buildType,pcVar9,(allocator *)&sFlagVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != paVar2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::UpperCase(&linkLanguage,&buildType);
  std::__cxx11::string::operator=((string *)&buildType,(string *)&linkLanguage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != paVar2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  iVar8 = cmGeneratorTarget::GetType(target);
  switch(iVar8) {
  case 0:
    pcVar5 = this->Makefile;
    linkLanguage._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&linkLanguage,"CMAKE_EXE_LINKER_FLAGS","");
    cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
    std::__cxx11::string::append((char *)linkFlags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != paVar2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (buildType._M_string_length != 0) {
      linkLanguage._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&linkLanguage,"CMAKE_EXE_LINKER_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&linkLanguage,(ulong)buildType._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(this->Makefile,&linkLanguage);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != paVar2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
    }
    cmTarget::GetLinkerLanguage(&linkLanguage,target->Target,&buildType);
    if (linkLanguage._M_string_length == 0) {
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",
                 (target->Target->Name)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    }
    else {
      AddLanguageFlags(this,flags,&linkLanguage,&buildType);
      OutputLinkLibraries(this,local_90,local_88,local_80,target,false,false,useWatcomQuote);
      pcVar5 = this->Makefile;
      paVar3 = &sFlagVar.field_2;
      sFlagVar._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"BUILD_SHARED_LIBS","");
      pcVar9 = cmMakefile::GetDefinition(pcVar5,&sFlagVar);
      bVar7 = cmSystemTools::IsOn(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CMAKE_SHARED_BUILD_","")
        ;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_50,(ulong)linkLanguage._M_dataplus._M_p);
        paVar4 = &local_b0.field_2;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_b0.field_2._M_allocated_capacity = *puVar13;
          local_b0.field_2._8_4_ = (undefined4)plVar10[3];
          local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
          local_b0._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *puVar13;
          local_b0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b0._M_string_length = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"_FLAGS","");
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar4) {
          uVar14 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_70 + local_b0._M_string_length) {
          uVar15 = 0xf;
          if (local_78 != local_68) {
            uVar15 = local_68[0];
          }
          if (uVar15 < local_70 + local_b0._M_string_length) goto LAB_002bf6d9;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_78,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
LAB_002bf6d9:
          puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_78)
          ;
        }
        psVar1 = puVar12 + 2;
        if ((size_type *)*puVar12 == psVar1) {
          sFlagVar.field_2._M_allocated_capacity = *psVar1;
          sFlagVar.field_2._8_8_ = puVar12[3];
          sFlagVar._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          sFlagVar.field_2._M_allocated_capacity = *psVar1;
          sFlagVar._M_dataplus._M_p = (pointer)*puVar12;
        }
        sFlagVar._M_string_length = puVar12[1];
        *puVar12 = psVar1;
        puVar12[1] = 0;
        *(char *)psVar1 = '\0';
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar4) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        cmMakefile::GetSafeDefinition(this->Makefile,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sFlagVar._M_dataplus._M_p != paVar3) {
          operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
        }
      }
      sFlagVar._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"WIN32_EXECUTABLE","");
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,&sFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = this->Makefile;
      if (bVar7) {
        sFlagVar._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sFlagVar,"CMAKE_CREATE_WIN32_EXE","");
        cmMakefile::GetSafeDefinition(pcVar5,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
      }
      else {
        sFlagVar._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sFlagVar,"CMAKE_CREATE_CONSOLE_EXE","");
        cmMakefile::GetSafeDefinition(pcVar5,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      bVar7 = cmTarget::IsExecutableWithExports(target->Target);
      if (bVar7) {
        sFlagVar._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"CMAKE_EXE_EXPORTS_","")
        ;
        std::__cxx11::string::_M_append((char *)&sFlagVar,(ulong)linkLanguage._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&sFlagVar);
        cmMakefile::GetSafeDefinition(this->Makefile,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sFlagVar._M_dataplus._M_p != paVar3) {
          operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
        }
      }
      sFlagVar._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"LINK_FLAGS","");
      pcVar9 = cmGeneratorTarget::GetProperty(target,&sFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar3) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      if (pcVar9 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if (buildType._M_string_length != 0) {
        sFlagVar._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"LINK_FLAGS_","");
        std::__cxx11::string::_M_append((char *)&sFlagVar,(ulong)buildType._M_dataplus._M_p);
        pcVar9 = cmGeneratorTarget::GetProperty(target,&sFlagVar);
        if (pcVar9 != (char *)0x0) {
          std::__cxx11::string::append((char *)linkFlags);
          std::__cxx11::string::append((char *)linkFlags);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sFlagVar._M_dataplus._M_p != paVar3) {
          operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != paVar2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    break;
  case 1:
    GetStaticLibraryFlags(this,linkFlags,&buildType,target->Target);
    break;
  case 2:
    pcVar9 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_002bf162;
  case 3:
    pcVar9 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_002bf162:
    pcVar5 = this->Makefile;
    linkLanguage._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,pcVar9,pcVar9 + 0x19);
    __s = cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
    pcVar6 = (char *)linkFlags->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)linkFlags,0,pcVar6,(ulong)__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != paVar2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (buildType._M_string_length != 0) {
      linkLanguage._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,pcVar9,pcVar9 + 0x19);
      std::__cxx11::string::append((char *)&linkLanguage);
      std::__cxx11::string::_M_append((char *)&linkLanguage,(ulong)buildType._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(this->Makefile,&linkLanguage);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != paVar2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
    }
    pcVar5 = this->Makefile;
    linkLanguage._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"WIN32","");
    bVar7 = cmMakefile::IsOn(pcVar5,&linkLanguage);
    if (bVar7) {
      pcVar5 = this->Makefile;
      sFlagVar._M_dataplus._M_p = (pointer)&sFlagVar.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"CYGWIN","");
      bVar7 = cmMakefile::IsOn(pcVar5,&sFlagVar);
      if (bVar7) {
        bVar7 = false;
      }
      else {
        pcVar5 = this->Makefile;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MINGW","");
        bVar7 = cmMakefile::IsOn(pcVar5,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        bVar7 = !bVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != &sFlagVar.field_2) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != paVar2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      sFlagVar._M_dataplus._M_p = (pointer)0x0;
      sFlagVar._M_string_length = 0;
      sFlagVar.field_2._M_allocated_capacity = 0;
      cmGeneratorTarget::GetSourceFiles
                (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&sFlagVar,
                 &buildType);
      if (sFlagVar._M_dataplus._M_p != (pointer)sFlagVar._M_string_length) {
        local_58 = &this->super_cmOutputConverter;
        _Var16 = sFlagVar._M_dataplus;
        do {
          this_00 = *(cmSourceFile **)_Var16._M_p;
          psVar11 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
          iVar8 = std::__cxx11::string::compare((char *)psVar11);
          if (iVar8 == 0) {
            pcVar5 = this->Makefile;
            linkLanguage._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&linkLanguage,"CMAKE_LINK_DEF_FILE_FLAG","");
            cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
            std::__cxx11::string::append((char *)linkFlags);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkLanguage._M_dataplus._M_p != paVar2) {
              operator_delete(linkLanguage._M_dataplus._M_p,
                              linkLanguage.field_2._M_allocated_capacity + 1);
            }
            psVar11 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
            cmOutputConverter::Convert(&linkLanguage,local_58,psVar11,FULL,SHELL);
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)linkLanguage._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkLanguage._M_dataplus._M_p != paVar2) {
              operator_delete(linkLanguage._M_dataplus._M_p,
                              linkLanguage.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)linkFlags);
          }
          _Var16._M_p = _Var16._M_p + 8;
        } while (_Var16._M_p != (pointer)sFlagVar._M_string_length);
      }
      if (sFlagVar._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(sFlagVar._M_dataplus._M_p,
                        sFlagVar.field_2._M_allocated_capacity - (long)sFlagVar._M_dataplus._M_p);
      }
    }
    linkLanguage._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"LINK_FLAGS","");
    pcVar9 = cmGeneratorTarget::GetProperty(target,&linkLanguage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != paVar2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    if (pcVar9 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (buildType._M_string_length != 0) {
      linkLanguage._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&linkLanguage,(ulong)buildType._M_dataplus._M_p);
      pcVar9 = cmGeneratorTarget::GetProperty(target,&linkLanguage);
      if (pcVar9 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != paVar2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
    }
    OutputLinkLibraries(this,local_90,local_88,local_80,target,false,false,useWatcomQuote);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buildType._M_dataplus._M_p != &buildType.field_2) {
    operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(std::string& linkLibs,
                                 std::string& flags,
                                 std::string& linkFlags,
                                 std::string& frameworkPath,
                                 std::string& linkPath,
                                 cmGeneratorTarget* target,
                                 bool useWatcomQuote)
{
  std::string buildType =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  buildType = cmSystemTools::UpperCase(buildType);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  switch(target->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target->Target);
      break;
    case cmTarget::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
    case cmTarget::SHARED_LIBRARY:
      {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      if(this->Makefile->IsOn("WIN32") &&
         !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW")))
        {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        for(std::vector<cmSourceFile*>::const_iterator i = sources.begin();
            i != sources.end(); ++i)
          {
          cmSourceFile* sf = *i;
          if(sf->GetExtension() == "def")
            {
            linkFlags +=
              this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
            linkFlags += this->Convert(sf->GetFullPath(),
                                       FULL, SHELL);
            linkFlags += " ";
            }
          }
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      }
      break;
    case cmTarget::EXECUTABLE:
      {
      linkFlags +=
        this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      std::string linkLanguage = target->Target->GetLinkerLanguage(buildType);
      if(linkLanguage.empty())
        {
        cmSystemTools::Error
          ("CMake can not determine linker language for target: ",
           target->Target->GetName().c_str());
        return;
        }
      this->AddLanguageFlags(flags, linkLanguage, buildType);
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      if(cmSystemTools::IsOn
         (this->Makefile->GetDefinition("BUILD_SHARED_LIBS")))
        {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_")
          + linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
        }
      if ( target->GetPropertyAsBool("WIN32_EXECUTABLE") )
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
        }
      else
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
        }
      if (target->Target->IsExecutableWithExports())
        {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags +=
          this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      }
      break;
    default:
      break;
    }
}